

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input_buffer.cc
# Opt level: O0

string * __thiscall
dtc::text_input_buffer::parse_node_or_property_name_abi_cxx11_
          (string *__return_storage_ptr__,text_input_buffer *this,bool *is_property)

{
  bool bVar1;
  text_input_buffer *ptVar2;
  allocator<char> local_61;
  __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_> local_60;
  __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_> local_58;
  char local_4d [8];
  char c_1;
  char local_39;
  undefined1 local_38 [7];
  char c;
  vector<char,_std::allocator<char>_> bytes;
  bool *is_property_local;
  text_input_buffer *this_local;
  
  bytes.super__Vector_base<char,_std::allocator<char>_>._M_impl._16_8_ = is_property;
  if ((*is_property & 1U) == 0) {
    std::vector<char,_std::allocator<char>_>::vector
              ((vector<char,_std::allocator<char>_> *)local_38);
    local_39 = operator*(this);
    while( true ) {
      bVar1 = anon_unknown_1::is_node_name_character::check(local_39);
      if (!bVar1) break;
      std::vector<char,_std::allocator<char>_>::push_back
                ((vector<char,_std::allocator<char>_> *)local_38,&local_39);
      ptVar2 = operator++(this);
      local_39 = operator*(ptVar2);
    }
    local_4d[0] = operator*(this);
    while( true ) {
      bVar1 = anon_unknown_1::is_property_name_character::check(local_4d[0]);
      if (!bVar1) break;
      std::vector<char,_std::allocator<char>_>::push_back
                ((vector<char,_std::allocator<char>_> *)local_38,local_4d);
      *(undefined1 *)bytes.super__Vector_base<char,_std::allocator<char>_>._M_impl._16_8_ = 1;
      ptVar2 = operator++(this);
      local_4d[0] = operator*(ptVar2);
    }
    local_58._M_current =
         (char *)std::vector<char,_std::allocator<char>_>::begin
                           ((vector<char,_std::allocator<char>_> *)local_38);
    local_60._M_current =
         (char *)std::vector<char,_std::allocator<char>_>::end
                           ((vector<char,_std::allocator<char>_> *)local_38);
    std::allocator<char>::allocator();
    std::__cxx11::string::
    string<__gnu_cxx::__normal_iterator<char*,std::vector<char,std::allocator<char>>>,void>
              ((string *)__return_storage_ptr__,local_58,local_60,&local_61);
    std::allocator<char>::~allocator(&local_61);
    std::vector<char,_std::allocator<char>_>::~vector
              ((vector<char,_std::allocator<char>_> *)local_38);
  }
  else {
    parse_property_name_abi_cxx11_(__return_storage_ptr__,this);
  }
  return __return_storage_ptr__;
}

Assistant:

string
text_input_buffer::parse_node_or_property_name(bool &is_property)
{
	if (is_property)
	{
		return parse_property_name();
	}
	std::vector<char> bytes;
	for (char c=*(*this) ; is_node_name_character::check(c) ; c=*(++(*this)))
	{
		bytes.push_back(c);
	}
	for (char c=*(*this) ; is_property_name_character::check(c) ; c=*(++(*this)))
	{
		bytes.push_back(c);
		is_property = true;
	}
	return string(bytes.begin(), bytes.end());
}